

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O3

void __thiscall
absl::lts_20250127::strings_internal::
SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::SplitIterator(SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *this,State state,
               Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *splitter)

{
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *pSVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  string_view sVar7;
  
  this->pos_ = 0;
  this->state_ = state;
  (this->curr_)._M_len = 0;
  (this->curr_)._M_str = (char *)0x0;
  this->splitter_ = splitter;
  (this->delimiter_).c_ = (splitter->delimiter_).c_;
  sVar4 = (splitter->text_)._M_len;
  if ((splitter->text_)._M_str == (char *)0x0) {
    this->state_ = kEndState;
  }
  else if (state != kEndState) {
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
    }
    else {
      pSVar1 = this->splitter_;
      uVar2 = (pSVar1->text_)._M_len;
      pcVar6 = (pSVar1->text_)._M_str;
      sVar7._M_len = (pSVar1->text_)._M_len;
      sVar7._M_str = (pSVar1->text_)._M_str;
      sVar7 = ByChar::Find(&this->delimiter_,sVar7,this->pos_);
      if (sVar7._M_str == pcVar6 + uVar2) {
        this->state_ = kLastState;
      }
      uVar3 = this->pos_;
      if (uVar2 < uVar3) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar3,uVar2);
      }
      pcVar6 = pcVar6 + uVar3;
      uVar5 = (long)sVar7._M_str - (long)pcVar6;
      if (uVar2 - uVar3 < uVar5) {
        uVar5 = uVar2 - uVar3;
      }
      (this->curr_)._M_len = uVar5;
      (this->curr_)._M_str = pcVar6;
      this->pos_ = sVar7._M_len + uVar3 + uVar5;
    }
    return;
  }
  this->pos_ = sVar4;
  return;
}

Assistant:

SplitIterator(State state, const Splitter* splitter)
      : pos_(0),
        state_(state),
        splitter_(splitter),
        delimiter_(splitter->delimiter()),
        predicate_(splitter->predicate()) {
    // Hack to maintain backward compatibility. This one block makes it so an
    // empty absl::string_view whose .data() happens to be nullptr behaves
    // *differently* from an otherwise empty absl::string_view whose .data() is
    // not nullptr. This is an undesirable difference in general, but this
    // behavior is maintained to avoid breaking existing code that happens to
    // depend on this old behavior/bug. Perhaps it will be fixed one day. The
    // difference in behavior is as follows:
    //   Split(absl::string_view(""), '-');  // {""}
    //   Split(absl::string_view(), '-');    // {}
    if (splitter_->text().data() == nullptr) {
      state_ = kEndState;
      pos_ = splitter_->text().size();
      return;
    }

    if (state_ == kEndState) {
      pos_ = splitter_->text().size();
    } else {
      ++(*this);
    }
  }